

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void CClient::ConchainWindowVSync
               (IResult *pResult,void *pUserData,FCommandCallback pfnCallback,
               void *pCallbackUserData)

{
  int iVar1;
  int iVar2;
  
  if ((*(long *)((long)pUserData + 0x58) != 0) && (pResult->m_NumArgs != 0)) {
    iVar1 = *(int *)(*(long *)((long)pUserData + 0x90) + 0xeb0);
    iVar2 = (*pResult->_vptr_IResult[2])(pResult,0);
    if (iVar1 == iVar2) {
      return;
    }
    (**(code **)(*pUserData + 0x80))(pUserData);
    return;
  }
  (*pfnCallback)(pResult,pCallbackUserData);
  return;
}

Assistant:

void CClient::ConchainWindowVSync(IConsole::IResult *pResult, void *pUserData, IConsole::FCommandCallback pfnCallback, void *pCallbackUserData)
{
	CClient *pSelf = (CClient *)pUserData;
	if(pSelf->Graphics() && pResult->NumArguments())
	{
		if(pSelf->Config()->m_GfxVsync != pResult->GetInteger(0))
			pSelf->ToggleWindowVSync();
	}
	else
		pfnCallback(pResult, pCallbackUserData);
}